

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_bindenv(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQNativeClosure *this;
  SQWeakRef *pSVar3;
  SQClass *pSVar4;
  SQDelegable *pSVar5;
  SQObjectPtr *pSVar6;
  SQObjectPtr *pSVar7;
  SQWeakRef *pSVar8;
  SQObjectValue SVar9;
  char *err;
  SQObjectPtr ret;
  SQObjectPtr local_30;
  
  if (idx < 0) {
    pSVar6 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar6 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  SVar2 = (pSVar6->super_SQObject)._type;
  if ((SVar2 == OT_CLOSURE) || (SVar2 == OT_NATIVECLOSURE)) {
    pSVar7 = SQVM::GetUp(v,-1);
    SVar2 = (pSVar7->super_SQObject)._type;
    if ((int)SVar2 < 0xa000020) {
      if ((SVar2 == OT_ARRAY) || (SVar2 == OT_CLASS)) {
LAB_00109e89:
        pSVar8 = SQRefCounted::GetWeakRef((pSVar7->super_SQObject)._unVal.pRefCounted,SVar2);
        local_30.super_SQObject._unVal.pTable = (SQTable *)0x0;
        local_30.super_SQObject._type = OT_NULL;
        this = (SQNativeClosure *)(pSVar6->super_SQObject)._unVal.pClosure;
        if ((pSVar6->super_SQObject)._type == OT_CLOSURE) {
          SVar9.pClosure = SQClosure::Clone((SQClosure *)this);
          pSVar3 = (SVar9.pClosure)->_env;
          if (pSVar3 != (SQWeakRef *)0x0) {
            pSVar1 = &(pSVar3->super_SQRefCounted)._uiRef;
            *pSVar1 = *pSVar1 - 1;
            if (*pSVar1 == 0) {
              (*(pSVar3->super_SQRefCounted)._vptr_SQRefCounted[2])();
            }
            ((SVar9.pTable)->super_SQDelegable)._delegate = (SQTable *)0x0;
          }
          SVar2 = local_30.super_SQObject._type;
          (SVar9.pClosure)->_env = pSVar8;
          pSVar1 = &(pSVar8->super_SQRefCounted)._uiRef;
          *pSVar1 = *pSVar1 + 1;
          pSVar4 = ((pSVar6->super_SQObject)._unVal.pClosure)->_base;
          if (pSVar4 != (SQClass *)0x0) {
            (SVar9.pClosure)->_base = pSVar4;
            pSVar1 = &(pSVar4->super_SQCollectable).super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
          }
          local_30.super_SQObject._type = OT_CLOSURE;
          pSVar1 = &((SVar9.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                    _uiRef;
          *pSVar1 = *pSVar1 + 1;
          if ((SVar2 >> 0x1b & 1) != 0) {
            pSVar1 = &((local_30.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 - 1;
            if (*pSVar1 == 0) {
              pSVar5 = &(local_30.super_SQObject._unVal.pTable)->super_SQDelegable;
              local_30.super_SQObject._unVal.pClosure = SVar9.pClosure;
              (*(pSVar5->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
              SVar9 = local_30.super_SQObject._unVal;
            }
          }
        }
        else {
          SVar9.pNativeClosure = SQNativeClosure::Clone(this);
          pSVar3 = (SVar9.pNativeClosure)->_env;
          if (pSVar3 != (SQWeakRef *)0x0) {
            pSVar1 = &(pSVar3->super_SQRefCounted)._uiRef;
            *pSVar1 = *pSVar1 - 1;
            if (*pSVar1 == 0) {
              (*(pSVar3->super_SQRefCounted)._vptr_SQRefCounted[2])();
            }
            ((SVar9.pGenerator)->_ci)._literals = (SQObjectPtr *)0x0;
          }
          SVar2 = local_30.super_SQObject._type;
          (SVar9.pNativeClosure)->_env = pSVar8;
          pSVar1 = &(pSVar8->super_SQRefCounted)._uiRef;
          *pSVar1 = *pSVar1 + 1;
          local_30.super_SQObject._type = OT_NATIVECLOSURE;
          pSVar1 = &((SVar9.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                    _uiRef;
          *pSVar1 = *pSVar1 + 1;
          if ((SVar2 >> 0x1b & 1) != 0) {
            pSVar1 = &((local_30.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 - 1;
            if (*pSVar1 == 0) {
              pSVar5 = &(local_30.super_SQObject._unVal.pTable)->super_SQDelegable;
              local_30.super_SQObject._unVal.pNativeClosure = SVar9.pNativeClosure;
              (*(pSVar5->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
              SVar9 = local_30.super_SQObject._unVal;
            }
          }
        }
        local_30.super_SQObject._unVal = SVar9;
        SQVM::Pop(v);
        SQVM::Push(v,&local_30);
        SQObjectPtr::~SQObjectPtr(&local_30);
        return 0;
      }
    }
    else if ((SVar2 == OT_TABLE) || (SVar2 == OT_INSTANCE)) goto LAB_00109e89;
    err = "invalid environment";
  }
  else {
    err = "the target is not a closure";
  }
  sq_throwerror(v,err);
  return -1;
}

Assistant:

SQRESULT sq_bindenv(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v,idx);
    if(!sq_isnativeclosure(o) &&
        !sq_isclosure(o))
        return sq_throwerror(v,_SC("the target is not a closure"));
    SQObjectPtr &env = stack_get(v,-1);
    if(!sq_istable(env) &&
        !sq_isarray(env) &&
        !sq_isclass(env) &&
        !sq_isinstance(env))
        return sq_throwerror(v,_SC("invalid environment"));
    SQWeakRef *w = _refcounted(env)->GetWeakRef(sq_type(env));
    SQObjectPtr ret;
    if(sq_isclosure(o)) {
        SQClosure *c = _closure(o)->Clone();
        __ObjRelease(c->_env);
        c->_env = w;
        __ObjAddRef(c->_env);
        if(_closure(o)->_base) {
            c->_base = _closure(o)->_base;
            __ObjAddRef(c->_base);
        }
        ret = c;
    }
    else { //then must be a native closure
        SQNativeClosure *c = _nativeclosure(o)->Clone();
        __ObjRelease(c->_env);
        c->_env = w;
        __ObjAddRef(c->_env);
        ret = c;
    }
    v->Pop();
    v->Push(ret);
    return SQ_OK;
}